

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

Abc_Cex_t * Abc_CexTransformTempor(Abc_Cex_t *p,int nPisOld,int nPosOld,int nRegsOld)

{
  int iVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  int local_34;
  int nFrames;
  int iBit;
  int k;
  int i;
  Abc_Cex_t *pCex;
  int nRegsOld_local;
  int nPosOld_local;
  int nPisOld_local;
  Abc_Cex_t *p_local;
  
  iVar1 = p->nPis / nPisOld + -1;
  if (p->iFrame < 1) {
    __assert_fail("p->iFrame > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                  ,0x1a4,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  if (p->nPis % nPisOld == 0) {
    pAVar3 = Abc_CexAlloc(nRegsOld,nPisOld,iVar1 + p->iFrame + 1);
    pAVar3->iPo = p->iPo;
    pAVar3->iFrame = iVar1 + p->iFrame;
    local_34 = nRegsOld;
    for (iBit = 0; iBit < iVar1; iBit = iBit + 1) {
      for (nFrames = 0; nFrames < nPisOld; nFrames = nFrames + 1) {
        iVar2 = Abc_InfoHasBit((uint *)(p + 1),p->nRegs + (iBit + 1) * nPisOld + nFrames);
        if (iVar2 != 0) {
          Abc_InfoSetBit((uint *)(pAVar3 + 1),local_34);
        }
        local_34 = local_34 + 1;
      }
    }
    for (iBit = 0; iBit <= p->iFrame; iBit = iBit + 1) {
      for (nFrames = 0; nFrames < nPisOld; nFrames = nFrames + 1) {
        iVar1 = Abc_InfoHasBit((uint *)(p + 1),p->nRegs + iBit * p->nPis + nFrames);
        if (iVar1 != 0) {
          Abc_InfoSetBit((uint *)(pAVar3 + 1),local_34);
        }
        local_34 = local_34 + 1;
      }
    }
    if (local_34 == pAVar3->nBits) {
      return pAVar3;
    }
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                  ,0x1b1,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  __assert_fail("p->nPis % nPisOld == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                ,0x1a5,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
}

Assistant:

Abc_Cex_t * Abc_CexTransformTempor( Abc_Cex_t * p, int nPisOld, int nPosOld, int nRegsOld )
{
    Abc_Cex_t * pCex;
    int i, k, iBit = nRegsOld, nFrames = p->nPis / nPisOld - 1;
    assert( p->iFrame > 0 ); // otherwise tempor did not properly check for failures in the prefix
    assert( p->nPis % nPisOld == 0 );
    pCex = Abc_CexAlloc( nRegsOld, nPisOld, nFrames + p->iFrame + 1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = nFrames + p->iFrame;
    for ( i = 0; i < nFrames; i++ )
        for ( k = 0; k < nPisOld; k++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + (i+1)*nPisOld + k) )
                Abc_InfoSetBit( pCex->pData, iBit );
    for ( i = 0; i <= p->iFrame; i++ )
        for ( k = 0; k < nPisOld; k++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + i*p->nPis + k) )
                Abc_InfoSetBit( pCex->pData, iBit );
    assert( iBit == pCex->nBits );
    return pCex;
}